

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_reorder_draw_order_list.hpp
# Opt level: O1

void __thiscall
PatchOptimizeReorderDrawOrderList::inject_code
          (PatchOptimizeReorderDrawOrderList *this,ROM *rom,World *world)

{
  ROM *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  LandstalkerException *this_01;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  AddressInRegister ret;
  Code func;
  allocator_type local_1ea;
  allocator_type local_1e9;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_1e8;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined **local_1b0;
  undefined1 local_1a8;
  undefined **local_1a0;
  undefined1 local_198;
  undefined **local_190;
  undefined1 local_188;
  undefined **local_180;
  undefined1 local_178;
  undefined **local_170;
  undefined1 local_168;
  undefined **local_160;
  undefined1 local_158;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_150;
  Code local_138;
  AddressRegister local_b8;
  undefined **local_a8;
  undefined1 local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined **local_58;
  undefined1 local_50;
  ROM *local_48;
  AddressRegister local_40;
  
  local_138._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_138._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_138._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_138._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_138._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_138._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR_getXn_00261bb0;
  local_1c0._M_local_buf[8] = 1;
  local_1c0._M_allocated_capacity = (size_type)&PTR_getXn_00261bb0;
  local_1a8 = 2;
  local_1b0 = &PTR_getXn_00261bb0;
  local_198 = 3;
  local_1a0 = &PTR_getXn_00261bb0;
  local_188 = 4;
  local_190 = &PTR_getXn_00261bb0;
  local_178 = 5;
  local_180 = &PTR_getXn_00261bb0;
  local_168 = 6;
  local_170 = &PTR_getXn_00261bb0;
  local_158 = 7;
  local_160 = &PTR_getXn_00261bb0;
  __l._M_len = 8;
  __l._M_array = (iterator)local_1d0;
  local_138._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_138._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_138._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_138._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_1e8,__l,&local_1e9);
  local_b8.super_Register._8_8_ = local_b8.super_Register._8_8_ & 0xffffffffffffff00;
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_a0 = 1;
  local_a8 = &PTR_getXn_00261c50;
  local_90 = 2;
  local_98 = &PTR_getXn_00261c50;
  local_80 = 3;
  local_88 = &PTR_getXn_00261c50;
  local_70 = 4;
  local_78 = &PTR_getXn_00261c50;
  local_60 = 5;
  local_68 = &PTR_getXn_00261c50;
  local_50 = 6;
  local_58 = &PTR_getXn_00261c50;
  __l_00._M_len = 7;
  __l_00._M_array = &local_b8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_150,__l_00,&local_1ea);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_138,&local_1e8,&local_150,true,&local_40,LONG);
  if (local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1d0._0_8_ = &PTR_getXn_00261cd8;
  local_1d0._8_8_ = 0x200ff5400;
  md::Code::lea(&local_138,(Param *)local_1d0,&local_b8);
  local_b8.super_Register._8_8_ = (ulong)(uint7)local_b8.super_Register._9_7_ << 8;
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1d0._0_8_ = &PTR_getXn_00261cd8;
  local_1d0._8_8_ = 0x200ff11de;
  md::Code::lea(&local_138,(Param *)local_1d0,&local_b8);
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_b8.super_Register._code = 0xfe;
  local_b8.super_Register._9_7_ = 0x200ff11;
  local_1d0._0_8_ = &PTR_getXn_00261c98;
  local_1d0._8_8_ = 0x10000ffff;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"loop_entity_1","");
  md::Code::label(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR_getXn_00261c50;
  local_b8.super_Register._code = '\x01';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,LONG);
  local_1d0[8] = '\x01';
  local_1d0._0_8_ = &PTR_getXn_00261c50;
  md::Code::addq(&local_138,'\x02',(Register *)local_1d0,LONG);
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_allocated_capacity = local_1c0._M_allocated_capacity & 0xffffffffffffff00;
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x20000;
  local_b8.super_Register._8_8_ = (ulong)(uint7)local_b8.super_Register._9_7_ << 8;
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"no_ret","");
  md::Code::bpl(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR_getXn_00261bb0;
  local_1c0._M_local_buf[8] = 1;
  local_1c0._M_allocated_capacity = (size_type)&PTR_getXn_00261bb0;
  local_1a8 = 2;
  local_1b0 = &PTR_getXn_00261bb0;
  local_198 = 3;
  local_1a0 = &PTR_getXn_00261bb0;
  local_188 = 4;
  local_190 = &PTR_getXn_00261bb0;
  local_178 = 5;
  local_180 = &PTR_getXn_00261bb0;
  local_168 = 6;
  local_170 = &PTR_getXn_00261bb0;
  local_158 = 7;
  local_160 = &PTR_getXn_00261bb0;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)local_1d0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_1e8,__l_01,&local_1e9);
  local_b8.super_Register._8_8_ = local_b8.super_Register._8_8_ & 0xffffffffffffff00;
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_a0 = 1;
  local_a8 = &PTR_getXn_00261c50;
  local_90 = 2;
  local_98 = &PTR_getXn_00261c50;
  local_80 = 3;
  local_88 = &PTR_getXn_00261c50;
  local_70 = 4;
  local_78 = &PTR_getXn_00261c50;
  local_60 = 5;
  local_68 = &PTR_getXn_00261c50;
  local_50 = 6;
  local_58 = &PTR_getXn_00261c50;
  __l_02._M_len = 7;
  __l_02._M_array = &local_b8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_150,__l_02,&local_1ea);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_138,&local_1e8,&local_150,false,&local_40,LONG);
  if (local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  md::Code::rts(&local_138);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"no_ret","");
  md::Code::label(&local_138,(string *)local_1d0);
  local_48 = rom;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d58;
  local_1c0._M_allocated_capacity = (size_type)&local_1e8;
  local_1c0._8_4_ = 1;
  local_1c0._M_local_buf[0xc] = '\x18';
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 3;
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  local_1d0._8_8_ = &local_b8;
  md::Code::lea(&local_138,(Param *)local_1d0,(AddressRegister *)&local_150);
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = '\x03';
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x30000;
  local_b8.super_Register._code = '\x02';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = '\x03';
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x30000;
  local_b8.super_Register._code = '\x03';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = '\x03';
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x30000;
  local_b8.super_Register._code = '\x04';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = 3;
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x20000;
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"loop_entity_2","");
  md::Code::label(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = 1;
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x20000;
  local_b8.super_Register._code = '\x01';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"next_loop_entity_1","");
  md::Code::bmi(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d58;
  local_1c0._M_allocated_capacity = (size_type)&local_1e8;
  local_1c0._8_4_ = 1;
  local_1c0._M_local_buf[0xc] = '\x1a';
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 2;
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._8_8_ = &local_b8;
  md::Code::cmp(&local_138,local_1d0,&local_150);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"next_loop_entity_2","");
  md::Code::bcc(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
  }
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d58;
  local_1c0._M_allocated_capacity = (size_type)&local_1e8;
  local_1c0._8_4_ = 1;
  local_1c0._M_local_buf[0xc] = '\x1e';
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 4;
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._8_8_ = &local_b8;
  md::Code::cmp(&local_138,local_1d0,&local_150);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"next_loop_entity_2","");
  md::Code::bcc(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
  }
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d58;
  local_1c0._M_allocated_capacity = (size_type)&local_1e8;
  local_1c0._8_4_ = 1;
  local_1c0._M_local_buf[0xc] = '\x18';
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 3;
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._8_8_ = &local_b8;
  md::Code::cmp(&local_138,local_1d0,&local_150);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"swap_a0_a1","");
  md::Code::bls(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
  }
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d58;
  local_1c0._M_allocated_capacity = (size_type)&local_1e8;
  local_1c0._8_4_ = 1;
  local_1c0._M_local_buf[0xc] = '\x1c';
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 5;
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._8_8_ = &local_b8;
  md::Code::cmp(&local_138,local_1d0,&local_150);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"swap_a0_a1","");
  md::Code::bls(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
  }
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d58;
  local_1c0._8_4_ = 1;
  local_1c0._M_local_buf[0xc] = '\x12';
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._8_8_ = &local_b8;
  local_1c0._M_allocated_capacity = (size_type)&local_1e8;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_150,WORD);
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d58;
  local_1c0._8_4_ = 1;
  local_1c0._M_local_buf[0xc] = '\x12';
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._8_8_ = &local_b8;
  local_1c0._M_allocated_capacity = (size_type)&local_1e8;
  md::Code::cmp(&local_138,local_1d0,&local_150);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"next_loop_entity_2","");
  md::Code::bcc(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
  }
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"swap_a0_a1","");
  md::Code::label(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
  }
  local_b8.super_Register._code = '\x01';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_allocated_capacity = local_1c0._M_allocated_capacity & 0xffffffffffffff00;
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x20000;
  md::Code::move(&local_138,(Param *)&local_b8,(Param *)local_1d0,WORD);
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = 1;
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x20000;
  md::Code::move(&local_138,(Param *)&local_b8,(Param *)local_1d0,WORD);
  local_1d0[8] = '\x01';
  local_1d0._0_8_ = &PTR_getXn_00261bb0;
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_1d0._0_8_ = &PTR_getXn_00261d58;
  local_1c0._M_allocated_capacity = (size_type)&local_1e8;
  local_1c0._8_4_ = 1;
  local_1c0._M_local_buf[0xc] = '\x18';
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 3;
  local_150.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  local_1d0._8_8_ = &local_b8;
  md::Code::lea(&local_138,(Param *)local_1d0,(AddressRegister *)&local_150);
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = '\x03';
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x30000;
  local_b8.super_Register._code = '\x02';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = '\x03';
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x30000;
  local_b8.super_Register._code = '\x03';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = '\x03';
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x30000;
  local_b8.super_Register._code = '\x04';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  this_00 = local_48;
  local_1d0._0_8_ = &PTR_getXn_00261d18;
  local_1c0._M_local_buf[0] = 3;
  local_1d0._8_8_ = &PTR_getXn_00261c50;
  local_1c0._8_3_ = 0x20000;
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_138,(Param *)local_1d0,(Param *)&local_b8,WORD);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"next_loop_entity_2","");
  md::Code::label(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_1d0[8] = 1;
  local_1d0._0_8_ = &PTR_getXn_00261c50;
  md::Code::addq(&local_138,'\x02',(Register *)local_1d0,LONG);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"loop_entity_2","");
  md::Code::bra(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"next_loop_entity_1","");
  md::Code::label(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR_getXn_00261c50;
  md::Code::addq(&local_138,'\x02',(Register *)local_1d0,LONG);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"loop_entity_1","");
  md::Code::bra(&local_138,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  md::ROM::set_code(this_00,0x49c0,&local_138);
  pvVar1 = md::Code::get_bytes(&local_138);
  if ((pointer)0xffffffffffffb5c4 <
      (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish +
      (-0x7b - (long)(pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_138._labels._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_138._pending_branches._M_t);
    if (local_138._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138._bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138._bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138._bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"Replacement function is too large and is overlapping other code!",
             "");
  LandstalkerException::LandstalkerException(this_01,(string *)local_1d0);
  __cxa_throw(this_01,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        constexpr uint8_t HitBoxXStart = 24;
        constexpr uint8_t HitBoxXEnd = 26;
        constexpr uint8_t HitBoxYStart = 28;
        constexpr uint8_t HitBoxYEnd = 30;
        constexpr uint8_t ZPos = 18;

        // A0 = address of the first entity inside draw order table being compared to others
        // A1 = address of the second entity inside draw order table being compared to A0

        md::Code func;
        func.movem_to_stack({ reg_D0_D7 }, { reg_A0_A6 });
        {
            func.lea(0xFF5400, reg_A5);
            func.lea(0xFF11DE, reg_A0);
            func.movew(0xFFFF, addr_(0xFF11FE)); // Put an "end" word at the end of the list

            // One turn of Loop_1 consists in comparing one A0 to eveyr subsequent A1. Loop_1 handles A0 value,
            // whereas changing A1 value is delegated to Loop_2.
            func.label("loop_entity_1");
            {
                // Put A1 one slot ahead of A0 to start the loop
                func.movel(reg_A0, reg_A1);
                func.addql(0x2, reg_A1);

                // Store A0 entity offset inside D0. If negative (0xFFFF), it means we reached the end of table.
                func.movew(addr_(reg_A0), reg_D0);
                func.bpl("no_ret");
                {
                    func.movem_from_stack({ reg_D0_D7 }, { reg_A0_A6 });
                    func.rts();
                }
                func.label("no_ret");

                func.lea(addrw_(reg_A5,reg_D0,HitBoxXStart), reg_A3);
                func.movew(addr_postinc_(reg_A3), reg_D2);
                func.movew(addr_postinc_(reg_A3), reg_D3);
                func.movew(addr_postinc_(reg_A3), reg_D4);
                func.movew(addr_(reg_A3), reg_D5);

                // Loop_2 consists looping A1 over every subsequent entity to A0 inside the table, comparing A0
                // to every following entity.
                func.label("loop_entity_2");
                {
                    // Store A1 entity offset inside D1. If negative (0xFFFF), it means we have finished comparing A0
                    // to all entities ahead of it, so we can increment A0 and go for another loop_1 turn.
                    func.movew(addr_(reg_A1), reg_D1);
                    func.bmi("next_loop_entity_1");

                    // If minX0 >= maxX1: D0 is in front of D1 -> order is good -> go to next entity
                    func.cmpw(addrw_(reg_A5,reg_D1,HitBoxXEnd), reg_D2);
                    func.bcc("next_loop_entity_2");

                    // If minY0 >= maxY1: D0 is in front of D1 -> order is good -> go to next entity
                    func.cmpw(addrw_(reg_A5,reg_D1,HitBoxYEnd), reg_D4);
                    func.bcc("next_loop_entity_2");

                    // If maxX0 < minX1: D1 is in front of D0 -> order is NOT good -> swap those two entities
                    func.cmpw(addrw_(reg_A5,reg_D1,HitBoxXStart), reg_D3);
                    func.bls("swap_a0_a1");

                    // If maxY0 < minY1: D1 is in front of D0 -> order is NOT good -> swap those two entities
                    func.cmpw(addrw_(reg_A5,reg_D1,HitBoxYStart), reg_D5);
                    func.bls("swap_a0_a1");

                    // If Z0 < Z1: D1 is in front of D0 -> order is NOT good -> swap those two entities
                    func.movew(addrw_(reg_A5,reg_D0,ZPos), reg_D6);
                    func.cmpw(addrw_(reg_A5,reg_D1,ZPos), reg_D6);
                    func.bcc("next_loop_entity_2");

                    func.label("swap_a0_a1");
                    {
                        // Swap A0 and A1 values
                        func.movew(reg_D1, addr_(reg_A0));
                        func.movew(reg_D0, addr_(reg_A1));

                        // Update D0 and related values
                        func.movew(reg_D1, reg_D0);

                        func.lea(addrw_(reg_A5,reg_D0,HitBoxXStart), reg_A3);
                        func.movew(addr_postinc_(reg_A3), reg_D2);
                        func.movew(addr_postinc_(reg_A3), reg_D3);
                        func.movew(addr_postinc_(reg_A3), reg_D4);
                        func.movew(addr_(reg_A3), reg_D5);
                    }
                    func.label("next_loop_entity_2");
                    func.addql(0x2, reg_A1);
                }
                func.bra("loop_entity_2");
            }
            func.label("next_loop_entity_1");
            func.addql(0x2, reg_A0);
            func.bra("loop_entity_1");
        }

        rom.set_code(0x49C0, func); // Replace original function
        if(0x49C0 + func.get_bytes().size() > 0x4A3A)
            throw LandstalkerException("Replacement function is too large and is overlapping other code!");
    }